

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O3

TestFactoryRegistry * CppUnit::TestFactoryRegistryList::getRegistry(string *name)

{
  TestFactoryRegistryList *this;
  TestFactoryRegistry *pTVar1;
  
  if (stateFlag(CppUnit::TestFactoryRegistryList::State)::state != 3) {
    this = getInstance();
    pTVar1 = getInternalRegistry(this,name);
    return pTVar1;
  }
  __assert_fail("isValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dlaperriere[P]cmake_cppunit/build_O3/cppunit-src/src/cppunit/TestFactoryRegistry.cpp"
                ,0x47,
                "static TestFactoryRegistry *CppUnit::TestFactoryRegistryList::getRegistry(const std::string &)"
               );
}

Assistant:

static TestFactoryRegistry *getRegistry( const std::string &name )
  {
    // If the following assertion failed, then TestFactoryRegistry::getRegistry() 
    // was called during static variable destruction without checking the registry 
    // validity beforehand using TestFactoryRegistry::isValid() beforehand.
    assert( isValid() );
    if ( !isValid() )         // release mode
      return NULL;            // => force CRASH

    return getInstance()->getInternalRegistry( name );
  }